

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_18d51b::LocalName::printLeft(LocalName *this,OutputStream *S)

{
  StringView R;
  
  Node::print(this->Encoding,S);
  R.Last = "";
  R.First = "::";
  OutputStream::operator+=(S,R);
  Node::print(this->Entity,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Encoding->print(S);
    S += "::";
    Entity->print(S);
  }